

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupOntop(Gia_Man_t *p,Gia_Man_t *p2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *pTemp;
  Gia_Man_t *p2_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  iVar2 = Gia_ManPiNum(p2);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManPoNum(p) == Gia_ManPiNum(p2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x79a,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x79b,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManRegNum(p2);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x79c,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  iVar2 = Gia_ManObjNum(p2);
  p_00 = Gia_ManStart(iVar1 + iVar2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCi(p,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(p_00);
    pGStack_30->Value = uVar3;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar7 = false;
    if (local_34 < p->nObjs) {
      pGStack_30 = Gia_ManObj(p,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      iVar2 = Gia_ObjFanin1Copy(pGStack_30);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      pGStack_30->Value = uVar3;
    }
    local_34 = local_34 + 1;
  }
  pGVar5 = Gia_ManConst0(p2);
  pGVar5->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCo(p,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ObjFanin0Copy(pGStack_30);
    pGVar5 = Gia_ManPi(p2,local_34);
    pGVar5->Value = uVar3;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar7 = false;
    if (local_34 < p2->nObjs) {
      pGStack_30 = Gia_ManObj(p2,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      iVar2 = Gia_ObjFanin1Copy(pGStack_30);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      pGStack_30->Value = uVar3;
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p2->vCos);
    bVar7 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCo(p2,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_30);
    uVar3 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_30->Value = uVar3;
    local_34 = local_34 + 1;
  }
  Gia_ManHashStop(p_00);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupOntop( Gia_Man_t * p, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == Gia_ManPiNum(p2) );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManRegNum(p2) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManPi(p2, i)->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p2, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
//    Gia_ManPrintStats( pGiaNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}